

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix3f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ulong uVar6;
  char cVar7;
  matrix3f value;
  char c;
  undefined1 local_78 [32];
  float local_58;
  string local_50;
  
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (bVar5) {
    local_78._0_8_ = (pointer)0x3f800000;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0x3f800000;
    local_78._24_4_ = 0.0;
    local_78._28_4_ = 0.0;
    local_58 = 1.0;
    bVar5 = ParseMatrix(this,(matrix3f *)local_78);
    if (bVar5) {
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>::
        _M_realloc_insert<tinyusdz::value::matrix3f_const&>
                  ((vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>> *)
                   result,iVar3,(matrix3f *)local_78);
      }
      else {
        (iVar3._M_current)->m[2][2] = local_58;
        *(undefined8 *)((iVar3._M_current)->m[1] + 1) = local_78._16_8_;
        *(undefined8 *)(iVar3._M_current)->m[2] = local_78._24_8_;
        *(undefined8 *)(iVar3._M_current)->m[0] = local_78._0_8_;
        *(undefined8 *)((iVar3._M_current)->m[0] + 2) = local_78._8_8_;
        ppmVar1 = &(result->
                   super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppmVar1 = *ppmVar1 + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar5) {
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003d3c97;
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = Char1(this,(char *)&local_50);
        cVar7 = '\x01';
        if (bVar5) {
          if ((char)local_50._M_dataplus._M_p == sep) {
            bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar5) {
              bVar5 = LookChar1(this,local_78);
              cVar7 = (local_78[0] == (string)end_symbol) * '\x03';
              if (!bVar5) {
                cVar7 = '\x01';
              }
              if (local_78[0] != (string)end_symbol && bVar5) goto LAB_003d3be1;
            }
          }
          else {
LAB_003d3be1:
            if ((char)local_50._M_dataplus._M_p == sep) {
              cVar7 = '\x01';
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (bVar5) {
                local_78._0_8_ = (pointer)0x3f800000;
                local_78._8_8_ = 0;
                local_78._16_8_ = 0x3f800000;
                local_78._24_4_ = 0.0;
                local_78._28_4_ = 0.0;
                local_58 = 1.0;
                bVar5 = ParseMatrix(this,(matrix3f *)local_78);
                cVar7 = '\x03';
                if (bVar5) {
                  iVar3._M_current =
                       (result->
                       super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (result->
                      super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::
                    vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>::
                    _M_realloc_insert<tinyusdz::value::matrix3f_const&>
                              ((vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>
                                *)result,iVar3,(matrix3f *)local_78);
                  }
                  else {
                    (iVar3._M_current)->m[2][2] = local_58;
                    *(undefined8 *)((iVar3._M_current)->m[1] + 1) = local_78._16_8_;
                    *(undefined8 *)(iVar3._M_current)->m[2] = local_78._24_8_;
                    *(undefined8 *)(iVar3._M_current)->m[0] = local_78._0_8_;
                    *(undefined8 *)((iVar3._M_current)->m[0] + 2) = local_78._8_8_;
                    ppmVar1 = &(result->
                               super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppmVar1 = *ppmVar1 + 1;
                  }
                  cVar7 = '\0';
                }
              }
            }
            else {
              pSVar4 = this->_sr;
              cVar7 = '\x03';
              if ((0 < (long)pSVar4->idx_) && (uVar6 = pSVar4->idx_ - 1, uVar6 <= pSVar4->length_))
              {
                pSVar4->idx_ = uVar6;
              }
            }
          }
        }
      } while (cVar7 == '\0');
      if (cVar7 != '\x01') {
LAB_003d3c97:
        if ((result->
            super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_78._0_8_ = local_78 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Empty array.\n","");
        PushError(this,(string *)local_78);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}